

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

string * __thiscall
VectorInstance::op_popFront
          (string *__return_storage_ptr__,VectorInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  pointer psVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar3;
  
  if ((arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (arguments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    psVar1 = (this->_value).
             super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->_value).
        super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>.
        _M_impl.super__Vector_impl_data._M_finish == psVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
    }
    else {
      peVar2 = (psVar1->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_00 = (psVar1->super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
      ;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      std::vector<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>::_M_erase
                (&this->_value,
                 (this->_value).
                 super__Vector_base<std::shared_ptr<Instance>,_std::allocator<std::shared_ptr<Instance>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      (*peVar2->_vptr_Instance[2])(__return_storage_ptr__,peVar2);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    return __return_storage_ptr__;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "RuntimeError: wrong number of arguments.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

std::string StringInstance::op_last(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    int n = IntegerInstance(arguments[0]).value();
    if (n < 0)
        throw EXC_INVALID_ARGUMENT;
    n = std::min(n, int(_value.size()));
    return "\"" + str_utils::escape(_value.substr(int(_value.size()) - n), '"') + "\"";
}